

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

double FIX::double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  double dVar7;
  sbyte sVar8;
  byte bVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  Double *pDVar14;
  Double *this;
  ulong uVar15;
  byte bVar16;
  DiyFp diy_fp;
  ulong uVar13;
  
  if (*current == end) {
    __assert_fail("*current != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x21d,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                 );
  }
  sVar8 = 0x18;
  if (read_as_double) {
    sVar8 = 0x35;
  }
  *result_is_junk = true;
  pcVar5 = *current;
  while (*pcVar5 == '0') {
    pcVar5 = pcVar5 + 1;
    *current = pcVar5;
    if (pcVar5 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  pcVar5 = *current;
  uVar15 = 0;
  this = (Double *)0x0;
  do {
    iVar3 = (int)*pcVar5;
    bVar11 = 9 < iVar3 - 0x30U || 0x37 < iVar3;
    uVar13 = (ulong)CONCAT31((int3)(iVar3 - 0x30U >> 8),bVar11);
    if (bVar11) {
      iVar3 = 4;
      if (!allow_trailing_junk) {
        bVar11 = pcVar5 != end;
        if ((bVar11) && (bVar2 = isWhitespace((int)*pcVar5), uVar13 = extraout_RDX, bVar2)) {
          do {
            pcVar5 = pcVar5 + 1;
            *current = pcVar5;
            bVar11 = pcVar5 != end;
            if (pcVar5 == end) break;
            bVar2 = isWhitespace((int)*pcVar5);
            uVar13 = extraout_RDX_00;
          } while (bVar2);
        }
        if (!bVar11) goto LAB_0016adb0;
        iVar3 = 1;
      }
    }
    else {
      pDVar14 = (Double *)((long)iVar3 + (long)this * 8 + -0x30);
      uVar6 = (long)pDVar14 >> sVar8;
      if ((int)uVar6 == 0) {
        pcVar5 = pcVar5 + 1;
        *current = pcVar5;
        iVar3 = 0;
        this = pDVar14;
      }
      else {
        uVar15 = 1;
        if (1 < (int)uVar6) {
          uVar10 = uVar6 & 0xffffffff;
          do {
            uVar15 = (ulong)((int)uVar15 + 1);
            uVar10 = uVar10 >> 1;
            uVar4 = (uint)uVar6;
            uVar6 = uVar10;
          } while (3 < uVar4);
        }
        bVar9 = (byte)uVar15;
        this = (Double *)((long)pDVar14 >> (bVar9 & 0x3f));
        pcVar5 = pcVar5 + 1;
        *current = pcVar5;
        bVar16 = 1;
        while (pcVar5 != end) {
          cVar1 = *pcVar5;
          if ((0x37 < cVar1) || (9 < (int)cVar1 - 0x30U)) break;
          bVar16 = bVar16 & cVar1 == '0';
          uVar15 = (ulong)((int)uVar15 + 3);
          pcVar5 = pcVar5 + 1;
          *current = pcVar5;
        }
        if (!allow_trailing_junk) {
          bVar11 = pcVar5 != end;
          if ((bVar11) && (bVar2 = isWhitespace((int)*pcVar5), uVar13 = extraout_RDX_01, bVar2)) {
            do {
              pcVar5 = pcVar5 + 1;
              *current = pcVar5;
              bVar11 = pcVar5 != end;
              if (pcVar5 == end) break;
              bVar2 = isWhitespace((int)*pcVar5);
              uVar13 = extraout_RDX_02;
            } while (bVar2);
          }
          iVar3 = 1;
          if (bVar11) goto LAB_0016adb5;
        }
        uVar12 = (uint)pDVar14 & ~(-1 << (bVar9 & 0x1f));
        uVar13 = (ulong)uVar12;
        uVar4 = 1 << (bVar9 - 1 & 0x1f);
        if ((int)uVar4 < (int)uVar12) {
          this = (Double *)((long)&this->d64_ + 1);
        }
        else if (uVar12 == uVar4) {
          this = (Double *)((long)&this->d64_ + (ulong)((byte)(~bVar16 | (byte)this) & 1));
        }
        bVar11 = (1L << sVar8 & (ulong)this) != 0;
        this = (Double *)((long)this >> bVar11);
        uVar15 = (ulong)((int)uVar15 + (uint)bVar11);
LAB_0016adb0:
        iVar3 = 4;
      }
    }
LAB_0016adb5:
    if (iVar3 != 0) {
      if (iVar3 != 4) {
        return junk_string_value;
      }
      goto LAB_0016adc9;
    }
    if (pcVar5 == end) {
LAB_0016adc9:
      if (1L << sVar8 <= (long)this) {
        __assert_fail("number < ((int64_t)1 << kSignificandSize)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x273,
                      "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                     );
      }
      if (this == (Double *)(long)(double)(long)this) {
        *result_is_junk = false;
        if ((int)uVar15 != 0) {
          if (this == (Double *)0x0) {
            __assert_fail("number != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                          ,0x280,
                          "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                         );
          }
          diy_fp._8_8_ = uVar13;
          diy_fp.f_ = uVar15;
          dVar7 = (double)Double::DiyFpToUint64(this,diy_fp);
          return dVar7;
        }
        if (sign) {
          if (this == (Double *)0x0) {
            return -0.0;
          }
          this = (Double *)-(long)this;
        }
        return (double)(long)this;
      }
      __assert_fail("static_cast<int64_t>(static_cast<double>(number)) == number",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x274,
                    "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                   );
    }
  } while( true );
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}